

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mode_t mVar5;
  uint uVar6;
  int *piVar7;
  la_int64_t lVar8;
  char *pcVar9;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar10;
  archive_string *paVar11;
  ulong uVar12;
  mtree_entry *pmVar13;
  size_t sVar14;
  long lVar15;
  size_t sVar16;
  mtree_entry *pmVar17;
  char *pcVar18;
  size_t sVar19;
  char *__s_00;
  char *pcVar20;
  byte *pbVar21;
  timespec *ptVar22;
  byte *pbVar23;
  undefined1 *puVar24;
  ulong uVar25;
  stat *__buf;
  mtree *pmVar26;
  byte *pbVar27;
  long lVar28;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_120;
  archive_read *local_118;
  mtree *local_110;
  char *local_108;
  uint local_fc;
  mtree_entry *local_f8;
  byte *local_f0;
  mtree_entry *local_e8;
  long local_e0;
  archive_entry *local_d8;
  mtree_entry *local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  pmVar26 = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (-1 < pmVar26->fd) {
    close(pmVar26->fd);
    pmVar26->fd = -1;
  }
  local_110 = pmVar26;
  if (pmVar26->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    pmVar26->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_d0 = (mtree_entry *)&pmVar26->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    pmVar26->archive_format = 0x80000;
    pmVar26->archive_format_name = "mtree";
    local_120 = (archive_entry *)0x0;
    detect_form(local_118,(int *)&local_d8);
    local_e0 = 1;
    local_f8 = (mtree_entry *)0x0;
LAB_004677ed:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) {
      uVar25 = 0;
      pcVar9 = local_108;
    }
    else {
      lVar28 = 0;
      uVar12 = 0;
      do {
        uVar25 = 0xffffffffffffffe2;
        pcVar9 = local_108;
        pmVar26 = local_110;
        if ((long)local_c0.st_dev < 0) goto LAB_004679ac;
        pvVar10 = memchr(__s,10,local_c0.st_dev);
        pmVar26 = local_110;
        if (pvVar10 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar10 + (1 - (long)__s);
        }
        if (0xffff < (long)(local_c0.st_dev + uVar12)) {
          archive_set_error(&local_118->archive,0x54,"Line too long");
          pcVar9 = local_108;
          pmVar26 = local_110;
          goto LAB_004679ac;
        }
        paVar11 = archive_string_ensure(&local_110->line,local_c0.st_dev + uVar12 + 1);
        if (paVar11 == (archive_string *)0x0) {
          archive_set_error(&local_118->archive,0xc,"Can\'t allocate working buffer");
          pcVar9 = local_108;
          goto LAB_004679ac;
        }
        memcpy((pmVar26->line).s + uVar12,__s,local_c0.st_dev);
        __archive_read_consume(local_118,local_c0.st_dev);
        uVar25 = uVar12 + local_c0.st_dev;
        (pmVar26->line).s[uVar25] = '\0';
        pcVar9 = (pmVar26->line).s;
        pbVar27 = (byte *)(pcVar9 + lVar28);
LAB_004678b1:
        bVar1 = *pbVar27;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar10 == (void *)0x0) goto LAB_004678f6;
          }
          else {
            if (bVar1 == 0) goto LAB_004678f6;
            pmVar26 = local_110;
            if (bVar1 == 10) goto LAB_004679ac;
          }
LAB_004678e7:
          pbVar27 = pbVar27 + 1;
          goto LAB_004678b1;
        }
        if ((bVar1 != 0x5c) || (pbVar27[1] == 0)) goto LAB_004678e7;
        if (pbVar27[1] != 10) {
          pbVar27 = pbVar27 + 1;
          goto LAB_004678e7;
        }
        pcVar9[uVar25 - 2] = '\0';
        uVar25 = uVar25 - 2;
LAB_004678f6:
        lVar28 = (long)pbVar27 - (long)(local_110->line).s;
        __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
        uVar12 = uVar25;
      } while (__s != (void *)0x0);
      uVar25 = 0;
      pcVar9 = local_108;
      pmVar26 = local_110;
    }
LAB_004679ac:
    iVar3 = (int)local_d8;
    if (uVar25 == 0) {
      pmVar26->this_entry = pmVar26->entries;
      free_options((mtree_option *)local_120);
      uVar25 = 0;
    }
    else {
      if (-1 < (long)uVar25) {
        for (lVar28 = 0; uVar12 = (ulong)(byte)pcVar9[lVar28], uVar12 < 0x30; lVar28 = lVar28 + 1) {
          if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
            if ((0x800002401U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00467ddb;
            if (uVar12 == 0x2f) {
              iVar3 = strncmp(pcVar9 + lVar28,"/set",4);
              if (iVar3 == 0) {
                if ((pcVar9[lVar28 + 4] == ' ') || (pcVar9[lVar28 + 4] == '\t')) {
                  pcVar18 = pcVar9 + lVar28 + 4;
                  goto LAB_00467b54;
                }
              }
              else {
                iVar3 = strncmp(pcVar9 + lVar28,"/unset",6);
                if ((iVar3 == 0) && ((pcVar9[lVar28 + 6] == ' ' || (pcVar9[lVar28 + 6] == '\t')))) {
                  pcVar18 = strchr(pcVar9 + lVar28 + 6,0x3d);
                  if (pcVar18 == (char *)0x0) {
                    sVar14 = strspn(pcVar9 + lVar28 + 6," \t\r\n");
                    uVar25 = 0;
                    if (pcVar9[lVar28 + 6 + sVar14] != '\0') {
                      pcVar18 = pcVar9 + lVar28 + sVar14 + 6;
                      do {
                        sVar14 = strcspn(pcVar18," \t\r\n");
                        if ((sVar14 == 3) && (iVar3 = strncmp(pcVar18,"all",3), iVar3 == 0)) {
                          free_options((mtree_option *)local_120);
                          local_120 = (archive_entry *)0x0;
                        }
                        else {
                          remove_option((mtree_option **)&local_120,pcVar18,sVar14);
                        }
                        pcVar20 = pcVar18 + sVar14;
                        sVar14 = strspn(pcVar20," \t\r\n");
                        pcVar18 = pcVar20 + sVar14;
                      } while (pcVar20[sVar14] != '\0');
                    }
                  }
                  else {
                    archive_set_error(&local_118->archive,-1,"/unset shall not contain `=\'");
                    uVar25 = 0xffffffe2;
                  }
                  goto LAB_00467dc8;
                }
              }
              archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",local_e0);
              free_options((mtree_option *)local_120);
              uVar25 = 0xffffffe2;
              pmVar26 = local_110;
              goto LAB_00467f17;
            }
            break;
          }
        }
        local_108 = pcVar9;
        pmVar13 = (mtree_entry *)malloc(0x20);
        if (pmVar13 == (mtree_entry *)0x0) {
          piVar7 = __errno_location();
          archive_set_error(&local_118->archive,*piVar7,"Can\'t allocate memory");
          uVar25 = 0xffffffe2;
          pcVar9 = local_108;
        }
        else {
          pbVar27 = (byte *)(local_108 + lVar28);
          sVar14 = uVar25 - lVar28;
          *(undefined8 *)((long)&pmVar13->options + 2) = 0;
          *(undefined8 *)((long)&pmVar13->name + 2) = 0;
          pmVar13->next = (mtree_entry *)0x0;
          pmVar13->options = (mtree_option *)0x0;
          pmVar17 = local_f8;
          if (local_f8 == (mtree_entry *)0x0) {
            pmVar17 = local_d0;
          }
          pmVar17->next = pmVar13;
          if (iVar3 == 0) {
            sVar16 = strcspn((char *)pbVar27," \t\r\n");
            local_f0 = pbVar27 + sVar16 + sVar14;
            pbVar21 = pbVar27 + sVar16;
            sVar14 = sVar16;
          }
          else {
            pbVar23 = pbVar27 + (sVar14 - 1);
            if (0 < (long)sVar14) {
              do {
                if ((0x20 < (ulong)*pbVar23) ||
                   ((0x100002600U >> ((ulong)*pbVar23 & 0x3f) & 1) == 0)) goto LAB_00467cc2;
                pbVar23 = pbVar23 + -1;
                bVar2 = 1 < (long)sVar14;
                sVar14 = sVar14 - 1;
              } while (bVar2);
              sVar14 = 0;
              pbVar23 = (byte *)(local_108 + lVar28 + -1);
            }
LAB_00467cc2:
            pbVar21 = pbVar27;
            if ((long)sVar14 < 1) {
              pbVar27 = pbVar23;
              sVar14 = 0;
              local_f0 = pbVar23;
            }
            else {
              pbVar27 = pbVar23 + -sVar14;
              lVar15 = 0;
              do {
                if (((ulong)pbVar23[lVar15] < 0x21) &&
                   ((0x100002600U >> ((ulong)pbVar23[lVar15] & 0x3f) & 1) != 0)) {
                  pbVar27 = pbVar23 + lVar15 + 1;
                  sVar14 = -lVar15;
                  local_f0 = pbVar23 + lVar15 + 1;
                  break;
                }
                lVar15 = lVar15 + -1;
                local_f0 = pbVar27;
              } while (sVar14 + lVar15 != 0);
            }
          }
          pcVar9 = (char *)malloc(sVar14 + 1);
          pmVar13->name = pcVar9;
          if (pcVar9 == (char *)0x0) {
            piVar7 = __errno_location();
            archive_set_error(&local_118->archive,*piVar7,"Can\'t allocate memory");
            uVar25 = 0xffffffe2;
            pcVar9 = local_108;
            local_f8 = pmVar13;
          }
          else {
            local_f8 = (mtree_entry *)&pmVar13->options;
            memcpy(pcVar9,pbVar27,sVar14);
            pcVar9[sVar14] = '\0';
            parse_escapes(pcVar9,pmVar13);
            puVar24 = (undefined1 *)&local_120;
            do {
              puVar24 = *(undefined1 **)puVar24;
              if (puVar24 == (undefined1 *)0x0) goto LAB_00467dfe;
              pcVar9 = *(char **)((long)puVar24 + 8);
              sVar14 = strlen(pcVar9);
              uVar6 = add_option(local_118,(mtree_option **)local_f8,pcVar9,sVar14);
            } while (uVar6 == 0);
            uVar25 = (ulong)uVar6;
            pcVar9 = local_108;
            local_f8 = pmVar13;
          }
        }
        goto LAB_00467dc8;
      }
      free_options((mtree_option *)local_120);
    }
    goto LAB_00467f17;
  }
LAB_004671bc:
  (local_118->archive).archive_format = pmVar26->archive_format;
  (local_118->archive).archive_format_name = pmVar26->archive_format_name;
  pmVar13 = pmVar26->this_entry;
  if (pmVar13 != (mtree_entry *)0x0) {
    paVar11 = &pmVar26->current_dir;
    do {
      iVar3 = strcmp(pmVar13->name,"..");
      if (iVar3 == 0) {
        pmVar13->used = '\x01';
        sVar19 = (pmVar26->current_dir).length;
        if (sVar19 != 0) {
          pcVar9 = (pmVar26->current_dir).s;
          pcVar18 = pcVar9 + sVar19;
          do {
            pcVar20 = pcVar18;
            pcVar18 = pcVar20 + -1;
            if (pcVar18 < pcVar9) break;
          } while (*pcVar18 != '/');
          pcVar20 = pcVar20 + -2;
          if (pcVar18 < pcVar9) {
            pcVar20 = pcVar18;
          }
          (pmVar26->current_dir).length = (size_t)(pcVar20 + (1 - (long)pcVar9));
        }
      }
      if (pmVar13->used == '\0') {
        local_120 = local_c8;
        pmVar13->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_120,0);
        (pmVar26->contents_name).length = 0;
        local_fc = 0;
        iVar3 = parse_line(local_118,local_120,pmVar26,pmVar13,(int *)&local_fc);
        if (pmVar13->full == '\0') {
          sVar19 = (pmVar26->current_dir).length;
          if (sVar19 != 0) {
            archive_strcat(paVar11,"/");
          }
          archive_strcat(paVar11,pmVar13->name);
          archive_entry_copy_pathname(local_120,paVar11->s);
          mVar5 = archive_entry_filetype(local_120);
          pmVar26 = local_110;
          if (mVar5 != 0x4000) {
            (local_110->current_dir).length = sVar19;
          }
        }
        else {
          archive_entry_copy_pathname(local_120,pmVar13->name);
          for (pmVar17 = pmVar13->next; pmVar17 != (mtree_entry *)0x0; pmVar17 = pmVar17->next) {
            if (((pmVar17->full != '\0') && (pmVar17->used == '\0')) &&
               (iVar4 = strcmp(pmVar13->name,pmVar17->name), iVar4 == 0)) {
              pmVar17->used = '\x01';
              iVar4 = parse_line(local_118,local_120,pmVar26,pmVar17,(int *)&local_fc);
              if (iVar4 < iVar3) {
                iVar3 = iVar4;
              }
            }
          }
        }
        if (pmVar26->checkfs == '\0') {
LAB_004676bf:
          lVar8 = archive_entry_size(local_120);
          pmVar26->cur_size = lVar8;
          pmVar26->offset = 0;
          bVar2 = true;
          iVar4 = iVar3;
        }
        else {
          pmVar26->fd = -1;
          if ((pmVar26->contents_name).length == 0) {
            pcVar9 = archive_entry_pathname(local_120);
          }
          else {
            pcVar9 = (pmVar26->contents_name).s;
          }
          mVar5 = archive_entry_filetype(local_120);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x4000)) {
            iVar4 = open(pcVar9,0x80000);
            pmVar26->fd = iVar4;
            __archive_ensure_cloexec_flag(iVar4);
            if (pmVar26->fd == -1) {
              piVar7 = __errno_location();
              if ((*piVar7 != 2) || ((pmVar26->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar7,"Can\'t open %s",pcVar9);
                iVar3 = -0x14;
              }
            }
          }
          if (pmVar26->fd < 0) {
            __buf = &local_c0;
            iVar4 = lstat(pcVar9,__buf);
            if (iVar4 == -1) goto LAB_00467476;
            ptVar22 = &local_c0.st_mtim;
          }
          else {
            __buf = &local_c0;
            iVar4 = fstat(pmVar26->fd,__buf);
            ptVar22 = &local_c0.st_mtim;
            if (iVar4 == -1) {
              piVar7 = __errno_location();
              archive_set_error(&local_118->archive,*piVar7,"Could not fstat %s",pcVar9);
              pmVar26 = local_110;
              close(local_110->fd);
              pmVar26->fd = -1;
              iVar3 = -0x14;
LAB_00467476:
              ptVar22 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar2 = false;
            pmVar26 = local_110;
            iVar4 = 0;
            if ((local_fc & 0x800) == 0) goto LAB_004676bf;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar5 = archive_entry_filetype(local_120), mVar5 == 0xa000)))) ||
                 (((~__buf->st_mode & 0xc000) == 0 &&
                  (mVar5 = archive_entry_filetype(local_120), mVar5 == 0xc000)))) ||
                (((__buf->st_mode & 0xf000) == 0x2000 &&
                 (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x2000)))) ||
               (((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x4000)))) ||
                (((__buf->st_mode & 0xf000) == 0x1000 &&
                 (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x1000)))))) {
              uVar6 = local_fc;
              if (((local_fc & 0x1001) != 1) &&
                 ((mVar5 = archive_entry_filetype(local_120), mVar5 == 0x2000 ||
                  (mVar5 = archive_entry_filetype(local_120), mVar5 == 0x6000)))) {
                archive_entry_set_rdev(local_120,__buf->st_rdev);
              }
              if ((uVar6 & 0xc) == 0 || (uVar6 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_120,(ulong)__buf->st_gid);
              }
              if ((uVar6 & 0x600) == 0 || (uVar6 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_120,(ulong)__buf->st_uid);
              }
              if ((uVar6 & 0x1010) != 0x10) {
                archive_entry_set_mtime(local_120,(__buf->st_mtim).tv_sec,ptVar22->tv_nsec);
              }
              if ((uVar6 & 0x1020) != 0x20) {
                archive_entry_set_nlink(local_120,(uint)__buf->st_nlink);
              }
              if ((uVar6 & 0x1040) != 0x40) {
                archive_entry_set_perm(local_120,__buf->st_mode);
              }
              if ((uVar6 & 0x1080) != 0x80) {
                archive_entry_set_size(local_120,__buf->st_size);
              }
              archive_entry_set_ino(local_120,__buf->st_ino);
              archive_entry_set_dev(local_120,__buf->st_dev);
              pmVar26 = local_110;
              archive_entry_linkify(local_110->resolver,&local_120,&local_d8);
              goto LAB_004676bf;
            }
            pmVar26 = local_110;
            if (-1 < local_110->fd) {
              close(local_110->fd);
            }
            pmVar26->fd = -1;
            iVar4 = iVar3;
            if ((local_fc & 0x800) == 0) {
              bVar2 = true;
              if (iVar3 == 0) {
                pcVar9 = archive_entry_pathname(local_120);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar9);
                iVar4 = -0x14;
                bVar2 = true;
              }
            }
            else {
              bVar2 = false;
            }
          }
        }
        if (bVar2) {
          return iVar4;
        }
      }
      pmVar13 = pmVar26->this_entry->next;
      pmVar26->this_entry = pmVar13;
    } while (pmVar13 != (mtree_entry *)0x0);
  }
  return 1;
  while( true ) {
    __s_00 = pcVar18 + sVar14;
    sVar14 = strcspn(__s_00," \t\r\n");
    pcVar18 = __s_00 + sVar14;
    pcVar20 = strchr(__s_00,0x3d);
    sVar19 = (long)pcVar20 - (long)__s_00;
    if (pcVar18 < pcVar20) {
      sVar19 = sVar14;
    }
    remove_option((mtree_option **)&local_120,__s_00,sVar19);
    uVar6 = add_option(local_118,(mtree_option **)&local_120,__s_00,sVar14);
    if (uVar6 != 0) break;
LAB_00467b54:
    sVar14 = strspn(pcVar18," \t\r\n");
    if (pcVar18[sVar14] == '\0') {
      uVar25 = 0;
      goto LAB_00467dc8;
    }
  }
  uVar25 = (ulong)uVar6;
  goto LAB_00467dc8;
  while( true ) {
    sVar16 = strcspn((char *)pbVar27," \t\r\n");
    pbVar21 = pbVar27 + sVar16;
    pbVar23 = (byte *)strchr((char *)pbVar27,0x3d);
    pmVar13 = local_f8;
    sVar14 = (long)pbVar23 - (long)pbVar27;
    if (pbVar21 < pbVar23) {
      sVar14 = sVar16;
    }
    if (pbVar23 == (byte *)0x0) {
      sVar14 = sVar16;
    }
    remove_option((mtree_option **)local_f8,(char *)pbVar27,sVar14);
    uVar6 = add_option(local_118,(mtree_option **)pmVar13,(char *)pbVar27,sVar16);
    pmVar13 = local_e8;
    if (uVar6 != 0) break;
LAB_00467dfe:
    local_e8 = pmVar13;
    sVar14 = strspn((char *)pbVar21," \t\r\n");
    uVar25 = 0;
    if ((pbVar21[sVar14] == 0) || (pbVar27 = pbVar21 + sVar14, local_f0 <= pbVar27)) {
      local_f8 = local_e8;
      pcVar9 = local_108;
      goto LAB_00467dc8;
    }
  }
  uVar25 = (ulong)uVar6;
  local_f8 = local_e8;
  pcVar9 = local_108;
LAB_00467dc8:
  if ((int)uVar25 != 0) goto LAB_00467ed9;
LAB_00467ddb:
  local_e0 = local_e0 + 1;
  local_108 = pcVar9 + lVar28;
  pmVar26 = local_110;
  goto LAB_004677ed;
LAB_00467ed9:
  free_options((mtree_option *)local_120);
  pmVar26 = local_110;
LAB_00467f17:
  if ((int)uVar25 != 0) {
    return (int)uVar25;
  }
  goto LAB_004671bc;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}